

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O2

bool __thiscall Clasp::SatElite::addResolvent(SatElite *this,uint32 id,Clause *lhs,Clause *rhs)

{
  LitVec *cl;
  undefined1 *puVar1;
  uint uVar2;
  uint32 size;
  size_type sVar3;
  Solver *this_00;
  bool bVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  Literal l;
  ulong local_38;
  
  cl = &this->resolvent_;
  (this->resolvent_).ebo_.size = 0;
  this_00 = *(((this->super_SatPreprocessor).ctx_)->solvers_).ebo_.buf;
  l.rep_ = 0;
  uVar2 = *(uint *)&lhs->field_0x8;
  local_38 = 0x4000000000000000;
  for (uVar8 = 1; (uVar2 & 0x3fffffff) != uVar8; uVar8 = uVar8 + 1) {
    l.rep_ = lhs->lits_[uVar8].rep_;
    bVar6 = *(byte *)((long)(this_00->assign_).assign_.ebo_.buf + (ulong)(l.rep_ & 0xfffffffc)) & 3;
    if (bVar6 != (byte)(((l.rep_ & 2) == 0) + 1U)) {
      if (bVar6 == (byte)(2U - ((l.rep_ & 2) == 0))) goto LAB_00187ee9;
      uVar7 = 0x8000000000000000;
      if ((l.rep_ & 2) == 0) {
        uVar7 = local_38;
      }
      *(ulong *)&this->occurs_[l.rep_ >> 2].field_0x18 =
           *(ulong *)&this->occurs_[l.rep_ >> 2].field_0x18 & 0x3fffffffffffffff | uVar7;
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(cl,&l);
    }
  }
  uVar2 = *(uint *)&rhs->field_0x8;
  for (uVar8 = 1; (uVar2 & 0x3fffffff) != uVar8; uVar8 = uVar8 + 1) {
    l.rep_ = rhs->lits_[uVar8].rep_;
    bVar6 = *(byte *)((long)(this_00->assign_).assign_.ebo_.buf + (ulong)(l.rep_ & 0xfffffffc)) & 3;
    if (bVar6 != (byte)(((l.rep_ & 2) == 0) + 1U)) {
      uVar7 = *(ulong *)&this->occurs_[l.rep_ >> 2].field_0x18;
      if ((2 - ((l.rep_ & 2) == 0) & (uint)(uVar7 >> 0x3e)) == 0) {
        if (bVar6 == (byte)(2U - ((l.rep_ & 2) == 0))) goto LAB_00187ee9;
        uVar5 = 0x8000000000000000;
        if ((l.rep_ & 2) == 0) {
          uVar5 = local_38;
        }
        *(ulong *)&this->occurs_[l.rep_ >> 2].field_0x18 = uVar7 & 0x3fffffffffffffff | uVar5;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(cl,&l);
      }
    }
  }
  bVar4 = subsumed(this,cl);
  if (bVar4) {
LAB_00187ee9:
    size = (this->resolvent_).ebo_.size;
    bVar4 = true;
    if (size != 0) {
      unmarkAll(this,(this->resolvent_).ebo_.buf,size);
    }
  }
  else {
    sVar3 = (this->resolvent_).ebo_.size;
    if (sVar3 == 1) {
      puVar1 = &this->occurs_[((this->resolvent_).ebo_.buf)->rep_ >> 2].field_0x18;
      *(ulong *)puVar1 = *(ulong *)puVar1 & 0x3fffffffffffffff;
      bVar4 = Solver::force(this_00,(Literal)((this->resolvent_).ebo_.buf)->rep_);
      if ((bVar4) && (bVar4 = Solver::propagate(this_00), bVar4)) {
        bVar4 = propagateFacts(this);
      }
      else {
        bVar4 = false;
      }
    }
    else if (sVar3 == 0) {
      bVar4 = Solver::force(this_00,(Literal)0x2);
    }
    else {
      SatPreprocessor::setClause(&this->super_SatPreprocessor,id,cl);
      attach(this,id,false);
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool SatElite::addResolvent(uint32 id, const Clause& lhs, const Clause& rhs) {
	resolvent_.clear();
	Solver* s = ctx_->master();
	assert(lhs[0] == ~rhs[0]);
	uint32 i, end;
	Literal l;
	for (i = 1, end = lhs.size(); i != end; ++i) {
		l = lhs[i];
		if (!s->isFalse(l)) {
			if (s->isTrue(l)) goto unmark;
			occurs_[l.var()].mark(l.sign());
			resolvent_.push_back(l);
		}
	}
	for (i = 1, end = rhs.size(); i != end; ++i) {
		l = rhs[i];
		if (!s->isFalse(l) && !occurs_[l.var()].marked(l.sign())) {
			if (s->isTrue(l)) goto unmark;
			occurs_[l.var()].mark(l.sign());
			resolvent_.push_back(l);
		}
	}
	if (!subsumed(resolvent_))  {
		if (resolvent_.empty())   {
			return s->force(negLit(0));
		}
		if (resolvent_.size()==1) {
			occurs_[resolvent_[0].var()].unmark();
			return s->force(resolvent_[0]) && s->propagate() && propagateFacts();
		}
		setClause(id, resolvent_);
		attach(id, false);
		return true;
	}
unmark:
	if (!resolvent_.empty()) {
		unmarkAll(&resolvent_[0], resolvent_.size());
	}
	return true;
}